

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddFile<google::protobuf::FileDescriptorProto>
          (DescriptorIndex *this,FileDescriptorProto *file,Value value)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  reference pvVar4;
  size_type sVar5;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  reference this_01;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_02;
  reference this_03;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_04;
  reference this_05;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_06;
  reference this_07;
  string_view sVar6;
  bool local_279;
  ServiceDescriptorProto *service;
  const_iterator __end0_3;
  const_iterator __begin0_3;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *__range2_3;
  FieldDescriptorProto *extension;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2_2;
  EnumDescriptorProto *enum_type;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *__range2_1;
  DescriptorProto *message_type;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  LogMessage local_150;
  Voidify local_139;
  DescriptorIndex *local_138;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_130;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>_>
  local_128;
  string_view local_120;
  value_type local_110;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>,_bool>
  local_e8;
  string_view local_d0;
  String local_c0;
  LogMessage local_98;
  Voidify local_81;
  undefined1 local_80 [16];
  value_type local_60;
  FileDescriptorProto *local_30;
  FileDescriptorProto *file_local;
  DescriptorIndex *this_local;
  Value value_local;
  
  local_60.data = value.first;
  local_60.size = value.second;
  local_30 = file;
  file_local = (FileDescriptorProto *)this;
  this_local = (DescriptorIndex *)local_60.data;
  value_local.first._0_4_ = local_60.size;
  std::__cxx11::string::string((string *)&local_60.encoded_package);
  std::
  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
  ::push_back(&this->all_values_,&local_60);
  EncodedEntry::~EncodedEntry(&local_60);
  psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
  local_80 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
  sVar6._M_str = local_80._8_8_;
  sVar6._M_len = (size_t)sVar6._M_str;
  bVar1 = anon_unknown_23::ValidateSymbolName(local_80._0_8_,sVar6);
  if (bVar1) {
    psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
    local_d0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    EncodeString_abi_cxx11_(&local_c0,this,local_d0);
    pvVar4 = std::
             vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
             ::back(&this->all_values_);
    std::__cxx11::string::operator=((string *)&pvVar4->encoded_package,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    sVar5 = std::
            vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
            ::size(&this->all_values_);
    local_110.data_offset = (int)sVar5 + -1;
    psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
    local_120 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    EncodeString_abi_cxx11_(&local_110.encoded_name,this,local_120);
    absl::lts_20250127::container_internal::
    btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
    ::insert(&local_e8,
             &(this->by_name_).
              super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
             ,&local_110);
    local_279 = true;
    if ((local_e8.second & 1U) != 0) {
      local_128._M_current =
           (FileEntry *)
           std::
           vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ::begin(&this->by_name_flat_);
      local_130._M_current =
           (FileEntry *)
           std::
           vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>_>
           ::end(&this->by_name_flat_);
      psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
      local_138 = (DescriptorIndex *)
                  absl::lts_20250127::container_internal::
                  btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                  ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>_>
                              *)&this->by_name_);
      local_279 = std::
                  binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>>>,std::__cxx11::string,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare>
                            (local_128,local_130,psVar2,(FileCompare)local_138);
    }
    FileEntry::~FileEntry(&local_110);
    if (local_279 == false) {
      this_00 = FileDescriptorProto::message_type(local_30);
      __end0 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
      message_type = (DescriptorProto *)
                     RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00);
      while( true ) {
        bVar1 = internal::operator!=(&__end0,(iterator *)&message_type);
        if (!bVar1) break;
        this_01 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*
                            (&__end0);
        psVar2 = DescriptorProto::name_abi_cxx11_(this_01);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddSymbol(this,sVar6);
        if (!bVar1) {
          return false;
        }
        psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,sVar6,this_01);
        if (!bVar1) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end0);
      }
      this_02 = FileDescriptorProto::enum_type(local_30);
      __end0_1 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::begin(this_02);
      enum_type = (EnumDescriptorProto *)
                  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::end(this_02);
      while( true ) {
        bVar1 = internal::operator!=(&__end0_1,(iterator *)&enum_type);
        if (!bVar1) break;
        this_03 = internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::
                  operator*(&__end0_1);
        psVar2 = EnumDescriptorProto::name_abi_cxx11_(this_03);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddSymbol(this,sVar6);
        if (!bVar1) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::EnumDescriptorProto>::operator++
                  (&__end0_1);
      }
      this_04 = FileDescriptorProto::extension(local_30);
      __end0_2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(this_04);
      extension = (FieldDescriptorProto *)
                  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_04);
      while( true ) {
        bVar1 = internal::operator!=(&__end0_2,(iterator *)&extension);
        if (!bVar1) break;
        this_05 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                  operator*(&__end0_2);
        psVar2 = FieldDescriptorProto::name_abi_cxx11_(this_05);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddSymbol(this,sVar6);
        if (!bVar1) {
          return false;
        }
        psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddExtension<google::protobuf::FieldDescriptorProto>(this,sVar6,this_05);
        if (!bVar1) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
                  (&__end0_2);
      }
      this_06 = FileDescriptorProto::service(local_30);
      __end0_3 = RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::begin(this_06);
      service = (ServiceDescriptorProto *)
                RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::end(this_06);
      while( true ) {
        bVar1 = internal::operator!=(&__end0_3,(iterator *)&service);
        if (!bVar1) break;
        this_07 = internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::
                  operator*(&__end0_3);
        psVar2 = ServiceDescriptorProto::name_abi_cxx11_(this_07);
        sVar6 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
        bVar1 = AddSymbol(this,sVar6);
        if (!bVar1) {
          return false;
        }
        internal::RepeatedPtrIterator<const_google::protobuf::ServiceDescriptorProto>::operator++
                  (&__end0_3);
      }
      value_local._15_1_ = 1;
    }
    else {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x2a6);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_150);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [34])"File already exists in database: ");
      psVar2 = FileDescriptorProto::name_abi_cxx11_(local_30);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,psVar2);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_139,pLVar3);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_150);
      value_local._15_1_ = 0;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x29b);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [23])"Invalid package name: ");
    psVar2 = FileDescriptorProto::package_abi_cxx11_(local_30);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,psVar2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar3);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_98);
    value_local._15_1_ = 0;
  }
  return (bool)value_local._15_1_;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddFile(const FileProto& file,
                                                         Value value) {
  // We push `value` into the array first. This is important because the AddXXX
  // functions below will expect it to be there.
  all_values_.push_back({value.first, value.second, {}});

  if (!ValidateSymbolName(file.package())) {
    ABSL_LOG(ERROR) << "Invalid package name: " << file.package();
    return false;
  }
  all_values_.back().encoded_package = EncodeString(file.package());

  if (!by_name_
           .insert({static_cast<int>(all_values_.size() - 1),
                    EncodeString(file.name())})
           .second ||
      std::binary_search(by_name_flat_.begin(), by_name_flat_.end(),
                         file.name(), by_name_.key_comp())) {
    ABSL_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  for (const auto& message_type : file.message_type()) {
    if (!AddSymbol(message_type.name())) return false;
    if (!AddNestedExtensions(file.name(), message_type)) return false;
  }
  for (const auto& enum_type : file.enum_type()) {
    if (!AddSymbol(enum_type.name())) return false;
  }
  for (const auto& extension : file.extension()) {
    if (!AddSymbol(extension.name())) return false;
    if (!AddExtension(file.name(), extension)) return false;
  }
  for (const auto& service : file.service()) {
    if (!AddSymbol(service.name())) return false;
  }

  return true;
}